

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O0

void telnet_begin_newenviron(telnet_t *telnet,uchar cmd)

{
  uchar local_11;
  telnet_t *ptStack_10;
  uchar cmd_local;
  telnet_t *telnet_local;
  
  local_11 = cmd;
  ptStack_10 = telnet;
  telnet_begin_sb(telnet,'\'');
  telnet_send(ptStack_10,(char *)&local_11,1);
  return;
}

Assistant:

void telnet_begin_newenviron(telnet_t *telnet, unsigned char cmd) {
	telnet_begin_sb(telnet, TELNET_TELOPT_NEW_ENVIRON);
	telnet_send(telnet, (const char *)&cmd, 1);
}